

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall
Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
          (Solver *this,uchar op,vec<Minisat::Lit> *c,FILE *drup_file)

{
  uchar *puVar1;
  OnlineProofChecker *this_00;
  byte *pbVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  puVar1 = *(uchar **)(this + 0x680);
  *(uchar **)(this + 0x680) = puVar1 + 1;
  *puVar1 = op;
  *(int *)(this + 0x678) = *(int *)(this + 0x678) + 1;
  this_00 = *(OnlineProofChecker **)(this + 0x210);
  if (this_00 != (OnlineProofChecker *)0x0) {
    if (op == 'a') {
      if (*(long *)(this_00 + 0xe8) != 0) {
        *(undefined4 *)(this_00 + 0xf0) = 0;
      }
      iVar5 = c->sz;
      if (0 < iVar5) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          if (*(int *)((long)&c->data->x + lVar7) != -2) {
            vec<Minisat::Lit>::push
                      ((vec<Minisat::Lit> *)(this_00 + 0xe8),(Lit *)((long)&c->data->x + lVar7));
            iVar5 = c->sz;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 4;
        } while (lVar8 < iVar5);
      }
      bVar4 = OnlineProofChecker::addClause(this_00,(vec<Minisat::Lit> *)(this_00 + 0xe8),false);
      if (bVar4) goto LAB_0010717e;
    }
    else {
      bVar4 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>(this_00,c);
      if (bVar4) goto LAB_0010717e;
    }
    exit(0x86);
  }
LAB_0010717e:
  if (0 < c->sz) {
    lVar7 = 0;
    do {
      uVar6 = c->data[lVar7].x + 2;
      do {
        pbVar2 = *(byte **)(this + 0x680);
        *(byte **)(this + 0x680) = pbVar2 + 1;
        *pbVar2 = (byte)uVar6 | 0x80;
        *(int *)(this + 0x678) = *(int *)(this + 0x678) + 1;
        bVar4 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar4);
      *(byte *)(*(long *)(this + 0x680) + -1) = *(byte *)(*(long *)(this + 0x680) + -1) & 0x7f;
      lVar7 = lVar7 + 1;
    } while (lVar7 < c->sz);
  }
  puVar3 = *(undefined1 **)(this + 0x680);
  *(undefined1 **)(this + 0x680) = puVar3 + 1;
  *puVar3 = 0;
  iVar5 = *(int *)(this + 0x678);
  uVar6 = iVar5 + 1;
  *(uint *)(this + 0x678) = uVar6;
  if (0xfffff < iVar5) {
    fwrite_unlocked(&drup_buf,1,(ulong)uVar6,(FILE *)drup_file);
    *(undefined8 **)(this + 0x680) = &drup_buf;
    *(undefined4 *)(this + 0x678) = 0;
  }
  return;
}

Assistant:

inline void binDRUP(unsigned char op, const V &c, FILE *drup_file)
    {
        assert(op == 'a' || op == 'd');
        *buf_ptr++ = op;
        buf_len++;
        if (onlineDratChecker) {
            if (op == 'a') {
                TRACE(if (!checkOnlineCheckerState(c)) {
                    std::cout << "c failed to validate online checker state" << std::endl;
                });

                if (!onlineDratChecker->addClause(c, lit_Undef)) {
                    exit(134);
                }
            } else {
                if (!onlineDratChecker->removeClause(c)) exit(134);
            }
        }
        for (int i = 0; i < c.size(); i++) byteDRUP(c[i]);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }